

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O3

bool duckdb::StringValueResult::EmptyLine(StringValueResult *result,idx_t buffer_pos)

{
  undefined8 *puVar1;
  uint uVar2;
  idx_t iVar3;
  idx_t iVar4;
  CSVStates *pCVar5;
  idx_t iVar6;
  CSVReaderOptions *pCVar7;
  _Bit_type *p_Var8;
  _Bit_type *p_Var9;
  ValidityMask *pVVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar11;
  _Alloc_hider _Var12;
  size_type sVar13;
  TemplatedValidityData<unsigned_long> *pTVar14;
  _Head_base<0UL,_unsigned_long_*,_false> _Var15;
  ulong uVar16;
  InternalException *this_00;
  ulong uVar17;
  string local_58;
  _Head_base<0UL,_unsigned_long_*,_false> local_38;
  
  iVar3 = (result->iterator->pos).buffer_idx;
  iVar4 = (result->iterator->pos).buffer_pos;
  pCVar5 = (result->super_ScannerResult).states;
  iVar6 = result->buffer_size;
  (result->super_ScannerResult).last_position.buffer_pos = iVar4 + 1;
  (result->super_ScannerResult).last_position.buffer_size = iVar6;
  (result->super_ScannerResult).last_position.buffer_idx = iVar3;
  if ((pCVar5->states[1] == CARRIAGE_RETURN) &&
     ((((result->super_ScannerResult).state_machine)->dialect_options).state_machine_options.
      new_line.value == CARRY_ON)) {
    (result->super_ScannerResult).last_position.buffer_pos = iVar4 + 2;
  }
  if (result->number_of_columns == 1) {
    uVar16 = result->null_str_count;
    if (uVar16 != 0) {
      uVar17 = 0;
      do {
        if ((result->null_str_size).
            super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl[uVar17] == 0) {
          pCVar7 = ((result->super_ScannerResult).state_machine)->options;
          p_Var8 = (pCVar7->force_not_null).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base._M_p;
          p_Var9 = (pCVar7->force_not_null).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base._M_p;
          uVar2 = *(uint *)((long)&(pCVar7->force_not_null).
                                   super_vector<bool,_std::allocator<bool>_>.
                                   super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8);
          if (uVar2 == 0 && p_Var8 == p_Var9) {
            uVar16 = result->number_of_rows;
LAB_017e985a:
            pVVar10 = *(result->validity_mask).
                       super_vector<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>
                       .
                       super__Vector_base<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            _Var15._M_head_impl =
                 (pVVar10->super_TemplatedValidityMask<unsigned_long>).validity_mask;
            if (_Var15._M_head_impl == (unsigned_long *)0x0) {
              local_38._M_head_impl =
                   (unsigned_long *)(pVVar10->super_TemplatedValidityMask<unsigned_long>).capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_58,(unsigned_long *)&local_38);
              sVar13 = local_58._M_string_length;
              _Var12._M_p = local_58._M_dataplus._M_p;
              local_58._M_dataplus._M_p = (pointer)0x0;
              local_58._M_string_length = 0;
              this = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(pVVar10->super_TemplatedValidityMask<unsigned_long>).validity_data + 8
                     ))->_M_pi;
              (pVVar10->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)_Var12._M_p;
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
              ((long)&(pVVar10->super_TemplatedValidityMask<unsigned_long>).validity_data + 8))->
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar13;
              if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length
                          );
              }
              pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(pVVar10->super_TemplatedValidityMask<unsigned_long>).
                                    validity_data);
              _Var15._M_head_impl =
                   (pTVar14->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (pVVar10->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                   _Var15._M_head_impl;
            }
            bVar11 = (byte)uVar16 & 0x3f;
            _Var15._M_head_impl[uVar16 >> 6] =
                 _Var15._M_head_impl[uVar16 >> 6] &
                 (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
          }
          else {
            if (((long)p_Var9 - (long)p_Var8) * 8 + (ulong)uVar2 == 0) {
              this_00 = (InternalException *)__cxa_allocate_exception(0x10);
              local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_58,
                         "Attempted to access index %ld within vector of size %ld","");
              InternalException::InternalException<unsigned_long,unsigned_long>
                        (this_00,&local_58,0,0);
              __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            uVar16 = result->number_of_rows;
            if ((*p_Var8 & 1) == 0) goto LAB_017e985a;
            puVar1 = (undefined8 *)
                     ((long)*(result->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                             super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_start + uVar16 * 0x10);
            *puVar1 = 0;
            puVar1[1] = 0;
          }
          result->number_of_rows = result->number_of_rows + 1;
          uVar16 = result->null_str_count;
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 < uVar16);
    }
    if ((result->super_ScannerResult).result_size <= (ulong)result->number_of_rows) {
      return true;
    }
  }
  return false;
}

Assistant:

bool StringValueResult::EmptyLine(StringValueResult &result, const idx_t buffer_pos) {
	// We care about empty lines if this is a single column csv file
	result.last_position = {result.iterator.pos.buffer_idx, result.iterator.pos.buffer_pos + 1, result.buffer_size};
	if (result.states.IsCarriageReturn() &&
	    result.state_machine.dialect_options.state_machine_options.new_line == NewLineIdentifier::CARRY_ON) {
		result.last_position.buffer_pos++;
	}
	if (result.number_of_columns == 1) {
		for (idx_t i = 0; i < result.null_str_count; i++) {
			if (result.null_str_size[i] == 0) {
				bool empty = false;
				if (!result.state_machine.options.force_not_null.empty()) {
					empty = result.state_machine.options.force_not_null[0];
				}
				if (empty) {
					static_cast<string_t *>(result.vector_ptr[0])[result.number_of_rows] = string_t();
				} else {
					result.validity_mask[0]->SetInvalid(static_cast<idx_t>(result.number_of_rows));
				}
				result.number_of_rows++;
			}
		}
		if (static_cast<idx_t>(result.number_of_rows) >= result.result_size) {
			// We have a full chunk
			return true;
		}
	}
	return false;
}